

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O3

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  FSE_DTable *pFVar6;
  uchar uVar7;
  BIT_DStream_status BVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  uchar *puVar14;
  byte bVar15;
  ulong uVar16;
  uchar *puVar17;
  int iVar18;
  FSE_DState_t *pFVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ushort *puVar24;
  ulong *puVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  size_t sVar29;
  bool bVar30;
  uint maxSymbolValue;
  uint tableLog;
  FSE_DState_t state1;
  BIT_DStream_t local_a0;
  uchar *local_78;
  ulong *local_70;
  FSE_DTable *local_68;
  uint local_60;
  uint local_5c;
  FSE_DState_t local_58;
  FSE_DState_t local_48;
  uchar *local_38;
  
  local_60 = 0xff;
  sVar13 = 0xffffffffffffffff;
  if (((0x203 < wkspSize) &&
      (local_70 = (ulong *)cSrc,
      sVar11 = FSE_readNCount_bmi2((short *)workSpace,&local_60,&local_5c,cSrc,cSrcSize,0),
      sVar13 = sVar11, sVar11 < 0xffffffffffffff89)) &&
     (sVar13 = 0xffffffffffffffd4, local_5c <= maxLog)) {
    uVar16 = cSrcSize - sVar11;
    if (cSrcSize < sVar11) {
      __assert_fail("NCountLength <= cSrcSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                    ,0x108,
                    "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                   );
    }
    lVar12 = (long)(1 << ((byte)local_5c & 0x1f));
    if (((1L << ((byte)local_5c & 0x3f)) + lVar12 * 4 + (ulong)(local_60 + 1) * 2 + 0x13 &
        0xfffffffffffffffc) + 0x204 <= wkspSize) {
      uVar28 = lVar12 * 4 + 0x208;
      if (wkspSize < uVar28) {
        __assert_fail("sizeof(*wksp) + FSE_DTABLE_SIZE(tableLog) <= wkspSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                      ,0x10e,
                      "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                     );
      }
      local_68 = (FSE_DTable *)((long)workSpace + 0x200);
      sVar13 = FSE_buildDTable_internal
                         (local_68,(short *)workSpace,local_60,local_5c,
                          (void *)((long)workSpace + lVar12 * 4 + 0x208),wkspSize - uVar28);
      pFVar6 = local_68;
      if (sVar13 < 0xffffffffffffff89) {
        puVar25 = (ulong *)(sVar11 + (long)local_70);
        local_78 = (uchar *)((long)dst + dstCapacity);
        local_38 = (uchar *)((long)dst + (dstCapacity - 3));
        if (*(short *)((long)workSpace + 0x202) == 0) {
          sVar13 = BIT_initDStream(&local_a0,puVar25,uVar16);
          pFVar6 = local_68;
          if (sVar13 < 0xffffffffffffff89) {
            FSE_initDState(&local_48,&local_a0,local_68);
            FSE_initDState(&local_58,&local_a0,pFVar6);
            local_70 = (ulong *)local_58.table;
            local_68 = (FSE_DTable *)local_48.table;
            puVar14 = (uchar *)dst;
            puVar17 = (uchar *)dst;
            puVar25 = (ulong *)local_a0.ptr;
            uVar16 = local_a0.bitContainer;
            sVar11 = local_48.state;
            sVar29 = local_58.state;
            uVar10 = local_a0.bitsConsumed;
            if (local_a0.bitsConsumed < 0x41) {
              do {
                puVar14 = puVar17;
                if (puVar25 < local_a0.limitPtr) {
                  if (puVar25 == (ulong *)local_a0.start) break;
                  bVar30 = local_a0.start <= (ulong *)((long)puVar25 - (ulong)(uVar10 >> 3));
                  uVar20 = (int)puVar25 - (int)local_a0.start;
                  if (bVar30) {
                    uVar20 = uVar10 >> 3;
                  }
                  uVar10 = uVar10 + uVar20 * -8;
                }
                else {
                  uVar20 = uVar10 >> 3;
                  uVar10 = uVar10 & 7;
                  bVar30 = true;
                }
                puVar25 = (ulong *)((long)puVar25 - (ulong)uVar20);
                uVar16 = *puVar25;
                if ((local_38 <= puVar17) || (!bVar30)) break;
                bVar15 = *(byte *)((long)local_48.table + sVar11 * 4 + 3);
                if (0x1f < bVar15) goto LAB_007bf127;
                uVar28 = (ulong)*(ushort *)((long)local_48.table + sVar11 * 4);
                *puVar17 = *(uchar *)((long)local_48.table + sVar11 * 4 + 2);
                bVar3 = *(byte *)((long)local_58.table + sVar29 * 4 + 3);
                if (0x1f < bVar3) goto LAB_007bf127;
                iVar18 = uVar10 + bVar15;
                uVar21 = ~(-1L << (bVar15 & 0x3f)) & uVar16 >> (-(char)iVar18 & 0x3fU);
                uVar22 = (ulong)*(ushort *)((long)local_58.table + sVar29 * 4);
                puVar17[1] = *(uchar *)((long)local_58.table + sVar29 * 4 + 2);
                bVar15 = *(byte *)((long)local_48.table + uVar28 * 4 + uVar21 * 4 + 3);
                if (0x1f < bVar15) goto LAB_007bf127;
                iVar18 = iVar18 + (uint)bVar3;
                uVar23 = ~(-1L << (bVar3 & 0x3f)) & uVar16 >> (-(char)iVar18 & 0x3fU);
                uVar4 = *(ushort *)((long)local_48.table + uVar28 * 4 + uVar21 * 4);
                puVar17[2] = *(uchar *)((long)local_48.table + uVar28 * 4 + uVar21 * 4 + 2);
                bVar3 = *(byte *)((long)local_58.table + uVar22 * 4 + uVar23 * 4 + 3);
                if (0x1f < bVar3) goto LAB_007bf127;
                iVar18 = iVar18 + (uint)bVar15;
                sVar11 = (~(-1L << (bVar15 & 0x3f)) & uVar16 >> (-(char)iVar18 & 0x3fU)) +
                         (ulong)uVar4;
                uVar10 = iVar18 + (uint)bVar3;
                sVar29 = (~(-1L << (bVar3 & 0x3f)) & uVar16 >> (-(char)uVar10 & 0x3fU)) +
                         (ulong)*(ushort *)((long)local_58.table + uVar22 * 4 + uVar23 * 4);
                puVar17[3] = *(uchar *)((long)local_58.table + uVar22 * 4 + uVar23 * 4 + 2);
                puVar14 = puVar17 + 4;
                puVar17 = puVar17 + 4;
                if (0x40 < uVar10) break;
              } while( true );
            }
            local_78 = local_78 + -2;
            sVar13 = 0xffffffffffffffba;
            if (puVar14 <= local_78) {
              lVar12 = (long)puVar14 - (long)dst;
              puVar14 = puVar14 + 1;
              local_a0.bitContainer = uVar16;
              local_a0.bitsConsumed = uVar10;
              local_a0.ptr = (char *)puVar25;
              do {
                puVar25 = local_70;
                bVar15 = *(byte *)((long)local_68 + sVar11 * 4 + 3);
                if (0x1f < bVar15) {
LAB_007bf127:
                  __assert_fail("nbBits < BIT_MASK_SIZE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                                ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
                }
                local_a0.bitsConsumed = bVar15 + local_a0.bitsConsumed;
                uVar16 = local_a0.bitContainer >> (-(char)local_a0.bitsConsumed & 0x3fU);
                uVar4 = *(ushort *)((long)local_68 + sVar11 * 4);
                puVar14[-1] = *(uchar *)((long)local_68 + sVar11 * 4 + 2);
                if (0x40 < local_a0.bitsConsumed) {
LAB_007bf086:
                  lVar27 = 2;
                  pFVar19 = &local_58;
                  local_58.state = sVar29;
                  goto LAB_007bf0ad;
                }
                if (local_a0.ptr < local_a0.limitPtr) {
                  if (local_a0.ptr != local_a0.start) {
                    uVar10 = (int)local_a0.ptr - (int)local_a0.start;
                    if (local_a0.start <=
                        (ulong *)((long)local_a0.ptr - (ulong)(local_a0.bitsConsumed >> 3))) {
                      uVar10 = local_a0.bitsConsumed >> 3;
                    }
                    local_a0.ptr = (char *)((long)local_a0.ptr - (ulong)uVar10);
                    local_a0.bitsConsumed = local_a0.bitsConsumed + uVar10 * -8;
                    local_a0.bitContainer = *(size_t *)local_a0.ptr;
                  }
                }
                else {
                  BVar8 = BIT_reloadDStreamFast(&local_a0);
                  if (BVar8 == BIT_DStream_overflow) goto LAB_007bf086;
                }
                if (local_78 < puVar14) {
                  return 0xffffffffffffffba;
                }
                bVar3 = *(byte *)((long)puVar25 + sVar29 * 4 + 3);
                if (0x1f < bVar3) goto LAB_007bf127;
                local_a0.bitsConsumed = bVar3 + local_a0.bitsConsumed;
                uVar5 = *(ushort *)((long)puVar25 + sVar29 * 4);
                uVar28 = local_a0.bitContainer >> (-(char)local_a0.bitsConsumed & 0x3fU);
                sVar11 = (uVar16 & ~(-1L << (bVar15 & 0x3f))) + (ulong)uVar4;
                *puVar14 = *(uchar *)((long)puVar25 + sVar29 * 4 + 2);
                if (0x40 < local_a0.bitsConsumed) {
LAB_007bf09b:
                  puVar14 = puVar14 + 1;
                  lVar27 = 3;
                  pFVar19 = &local_48;
                  local_48.state = sVar11;
LAB_007bf0ad:
                  uVar7 = FSE_decodeSymbol(pFVar19,&local_a0);
                  *puVar14 = uVar7;
                  return lVar27 + lVar12;
                }
                if (local_a0.ptr < local_a0.limitPtr) {
                  if (local_a0.ptr != local_a0.start) {
                    uVar10 = (int)local_a0.ptr - (int)local_a0.start;
                    if (local_a0.start <=
                        (ulong *)((long)local_a0.ptr - (ulong)(local_a0.bitsConsumed >> 3))) {
                      uVar10 = local_a0.bitsConsumed >> 3;
                    }
                    local_a0.ptr = (char *)((long)local_a0.ptr - (ulong)uVar10);
                    local_a0.bitsConsumed = local_a0.bitsConsumed + uVar10 * -8;
                    local_a0.bitContainer = *(size_t *)local_a0.ptr;
                  }
                }
                else {
                  BVar8 = BIT_reloadDStreamFast(&local_a0);
                  if (BVar8 == BIT_DStream_overflow) goto LAB_007bf09b;
                }
                sVar29 = (uVar28 & ~(-1L << (bVar3 & 0x3f))) + (ulong)uVar5;
                lVar12 = lVar12 + 2;
                puVar17 = puVar14 + 1;
                puVar14 = puVar14 + 2;
                sVar13 = 0xffffffffffffffba;
              } while (puVar17 <= local_78);
            }
          }
        }
        else if (uVar16 == 0) {
          sVar13 = 0xffffffffffffffb8;
        }
        else {
          local_a0.limitPtr = (char *)(puVar25 + 1);
          if (uVar16 < 8) {
            local_a0.bitContainer = (size_t)(byte)*puVar25;
            switch(uVar16) {
            case 7:
              local_a0.bitContainer =
                   local_a0.bitContainer | (ulong)*(byte *)((long)puVar25 + 6) << 0x30;
            case 6:
              local_a0.bitContainer =
                   local_a0.bitContainer + ((ulong)*(byte *)((long)puVar25 + 5) << 0x28);
            case 5:
              local_a0.bitContainer =
                   local_a0.bitContainer + ((ulong)*(byte *)((long)puVar25 + 4) << 0x20);
            case 4:
              local_a0.bitContainer =
                   local_a0.bitContainer + (ulong)*(byte *)((long)puVar25 + 3) * 0x1000000;
            case 3:
              local_a0.bitContainer =
                   local_a0.bitContainer + (ulong)*(byte *)((long)puVar25 + 2) * 0x10000;
            case 2:
              local_a0.bitContainer =
                   (ulong)*(byte *)((long)puVar25 + 1) * 0x100 + local_a0.bitContainer;
            }
            bVar15 = *(byte *)((long)local_70 + (cSrcSize - 1));
            if (bVar15 == 0) {
              return 0xffffffffffffffec;
            }
            uVar10 = 0x1f;
            if (bVar15 != 0) {
              for (; bVar15 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            local_a0.bitsConsumed = (uVar10 ^ 0x1f) + (int)uVar16 * -8 + 0x29;
            local_a0.ptr = (char *)puVar25;
          }
          else {
            local_a0.ptr = (char *)((long)local_70 + (cSrcSize - 8));
            local_a0.bitContainer = *(size_t *)local_a0.ptr;
            if (local_a0.bitContainer >> 0x38 == 0) {
              return 0xffffffffffffffff;
            }
            uVar10 = 0x1f;
            bVar15 = (byte)(local_a0.bitContainer >> 0x38);
            if (bVar15 != 0) {
              for (; bVar15 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            local_a0.bitsConsumed = ~uVar10 + 9;
            if (0xffffffffffffff88 < uVar16) {
              return uVar16;
            }
          }
          local_a0.start = (char *)puVar25;
          FSE_initDState(&local_48,&local_a0,local_68);
          FSE_initDState(&local_58,&local_a0,pFVar6);
          local_70 = (ulong *)local_a0.limitPtr;
          iVar18 = (int)local_a0.start;
          puVar14 = (uchar *)dst;
          puVar17 = (uchar *)dst;
          puVar25 = (ulong *)local_a0.ptr;
          sVar13 = local_58.state;
          uVar16 = local_a0.bitContainer;
          sVar11 = local_48.state;
          uVar10 = local_a0.bitsConsumed;
          if (local_a0.bitsConsumed < 0x41) {
            do {
              puVar14 = puVar17;
              if (puVar25 < local_a0.limitPtr) {
                if (puVar25 == (ulong *)local_a0.start) break;
                bVar30 = local_a0.start <= (ulong *)((long)puVar25 - (ulong)(uVar10 >> 3));
                uVar20 = (int)puVar25 - iVar18;
                if (bVar30) {
                  uVar20 = uVar10 >> 3;
                }
                uVar10 = uVar10 + uVar20 * -8;
              }
              else {
                uVar20 = uVar10 >> 3;
                uVar10 = uVar10 & 7;
                bVar30 = true;
              }
              puVar25 = (ulong *)((long)puVar25 - (ulong)uVar20);
              uVar16 = *puVar25;
              if ((local_38 <= puVar17) || (!bVar30)) break;
              bVar15 = *(byte *)((long)local_48.table + sVar11 * 4 + 3);
              uVar28 = local_a0.bitContainer;
              sVar29 = local_58.state;
              if (bVar15 == 0) goto LAB_007bf05b;
              uVar22 = (ulong)*(ushort *)((long)local_48.table + sVar11 * 4);
              *puVar17 = *(uchar *)((long)local_48.table + sVar11 * 4 + 2);
              bVar3 = *(byte *)((long)local_58.table + sVar13 * 4 + 3);
              if (bVar3 == 0) goto LAB_007bf05b;
              uVar21 = (uVar16 << ((byte)uVar10 & 0x3f)) >> (-bVar15 & 0x3f);
              uVar23 = (ulong)*(ushort *)((long)local_58.table + sVar13 * 4);
              puVar17[1] = *(uchar *)((long)local_58.table + sVar13 * 4 + 2);
              bVar1 = *(byte *)((long)local_48.table + uVar22 * 4 + uVar21 * 4 + 3);
              if (bVar1 == 0) goto LAB_007bf05b;
              uVar26 = (uVar16 << ((byte)(uVar10 + bVar15) & 0x3f)) >> (-bVar3 & 0x3f);
              uVar4 = *(ushort *)((long)local_48.table + uVar22 * 4 + uVar21 * 4);
              puVar17[2] = *(uchar *)((long)local_48.table + uVar22 * 4 + uVar21 * 4 + 2);
              bVar2 = *(byte *)((long)local_58.table + uVar23 * 4 + uVar26 * 4 + 3);
              if (bVar2 == 0) goto LAB_007bf05b;
              iVar9 = uVar10 + bVar15 + (uint)bVar3;
              sVar11 = ((uVar16 << ((byte)iVar9 & 0x3f)) >> (-bVar1 & 0x3f)) + (ulong)uVar4;
              iVar9 = iVar9 + (uint)bVar1;
              sVar13 = ((uVar16 << ((byte)iVar9 & 0x3f)) >> (-bVar2 & 0x3f)) +
                       (ulong)*(ushort *)((long)local_58.table + uVar23 * 4 + uVar26 * 4);
              uVar10 = iVar9 + (uint)bVar2;
              puVar17[3] = *(uchar *)((long)local_58.table + uVar23 * 4 + uVar26 * 4 + 2);
              puVar14 = puVar17 + 4;
              puVar17 = puVar17 + 4;
              if (0x40 < uVar10) break;
            } while( true );
          }
          local_78 = local_78 + -2;
          if (puVar14 <= local_78) {
            bVar15 = *(byte *)((long)local_48.table + sVar11 * 4 + 3);
            uVar28 = uVar16;
            sVar29 = sVar13;
            local_48.state = sVar11;
            if (bVar15 != 0) {
              puVar24 = (ushort *)((long)local_48.table + sVar11 * 4);
              lVar12 = (long)puVar14 - (long)dst;
              puVar14 = puVar14 + 1;
              local_58.state = sVar13;
              local_a0.bitContainer = uVar16;
              do {
                uVar16 = local_a0.bitContainer << ((byte)uVar10 & 0x3f);
                uVar10 = uVar10 + bVar15;
                uVar4 = *puVar24;
                puVar14[-1] = (uchar)puVar24[1];
                if (0x40 < uVar10) {
                  lVar27 = 2;
                  pFVar19 = &local_58;
                  local_a0.bitsConsumed = uVar10;
                  local_a0.ptr = (char *)puVar25;
                  local_48.state = sVar11;
                  goto LAB_007bf103;
                }
                if (puVar25 < local_a0.limitPtr) {
                  if (puVar25 != (ulong *)local_a0.start) {
                    uVar20 = (int)puVar25 - iVar18;
                    if (local_a0.start <= (ulong *)((long)puVar25 - (ulong)(uVar10 >> 3))) {
                      uVar20 = uVar10 >> 3;
                    }
                    uVar10 = uVar10 + uVar20 * -8;
                    goto LAB_007bef9b;
                  }
                }
                else {
                  uVar20 = uVar10 >> 3;
                  uVar10 = uVar10 & 7;
LAB_007bef9b:
                  puVar25 = (ulong *)((long)puVar25 - (ulong)uVar20);
                  local_a0.bitContainer = *puVar25;
                }
                if (local_78 < puVar14) goto LAB_007bef10;
                bVar3 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
                local_48.state = sVar11;
                if (bVar3 == 0) break;
                uVar5 = *(ushort *)((long)local_58.table + local_58.state * 4);
                uVar22 = local_a0.bitContainer << ((byte)uVar10 & 0x3f);
                local_48.state = (uVar16 >> (-bVar15 & 0x3f)) + (ulong)uVar4;
                uVar10 = uVar10 + bVar3;
                *puVar14 = *(uchar *)((long)local_58.table + local_58.state * 4 + 2);
                if (0x40 < uVar10) {
                  lVar27 = 3;
                  pFVar19 = &local_48;
                  puVar14 = puVar14 + 1;
                  local_a0.bitsConsumed = uVar10;
                  local_a0.ptr = (char *)puVar25;
                  local_58.state = sVar13;
LAB_007bf103:
                  uVar7 = FSE_decodeSymbolFast(pFVar19,&local_a0);
                  *puVar14 = uVar7;
                  return lVar27 + lVar12;
                }
                if (puVar25 < local_a0.limitPtr) {
                  if (puVar25 != (ulong *)local_a0.start) {
                    uVar20 = (int)puVar25 - iVar18;
                    if (local_a0.start <= (ulong *)((long)puVar25 - (ulong)(uVar10 >> 3))) {
                      uVar20 = uVar10 >> 3;
                    }
                    uVar10 = uVar10 + uVar20 * -8;
                    goto LAB_007bf02a;
                  }
                }
                else {
                  uVar20 = uVar10 >> 3;
                  uVar10 = uVar10 & 7;
LAB_007bf02a:
                  puVar25 = (ulong *)((long)puVar25 - (ulong)uVar20);
                  local_a0.bitContainer = *puVar25;
                }
                if (local_78 < puVar14 + 1) goto LAB_007bef10;
                local_58.state = (uVar22 >> (-bVar3 & 0x3f)) + (ulong)uVar5;
                puVar24 = (ushort *)((long)local_48.table + local_48.state * 4);
                bVar15 = *(byte *)((long)puVar24 + 3);
                lVar12 = lVar12 + 2;
                puVar14 = puVar14 + 2;
                local_48.state = sVar11;
              } while (bVar15 != 0);
            }
LAB_007bf05b:
            local_58.state = sVar29;
            local_a0.bitContainer = uVar28;
            __assert_fail("nbBits >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                          ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
          }
LAB_007bef10:
          sVar13 = 0xffffffffffffffba;
        }
      }
    }
  }
  return sVar13;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}